

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_group.hpp
# Opt level: O2

void __thiscall asio::detail::thread_group::join(thread_group *this)

{
  posix_thread *this_00;
  
  while (*(posix_thread **)this != (posix_thread *)0x0) {
    posix_thread::join(*(posix_thread **)this);
    this_00 = *(posix_thread **)this;
    *(pthread_t *)this = this_00[1].thread_;
    posix_thread::~posix_thread(this_00);
    operator_delete(this_00,0x18);
  }
  return;
}

Assistant:

void join()
  {
    while (first_)
    {
      first_->thread_.join();
      item* tmp = first_;
      first_ = first_->next_;
      delete tmp;
    }
  }